

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loader_croot(lua_State *L)

{
  lua_State *L_00;
  char *name_00;
  char *pcVar1;
  lua_State *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *unaff_retaddr;
  lua_State *in_stack_00000008;
  int st;
  char *p;
  char *name;
  char *filename;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  lua_State *L_01;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  L_00 = (lua_State *)
         luaL_checklstring(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)
                           ,in_stack_ffffffffffffffd8);
  name_00 = strchr((char *)L_00,0x2e);
  if (name_00 == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    lua_pushlstring(in_stack_ffffffffffffffe8,(char *)L_00,(size_t)name_00);
    L_01 = in_RDI;
    lua_tolstring(L_00,(int)((ulong)name_00 >> 0x20),
                  (size_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    pcVar1 = findfile(L_00,name_00,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (pcVar1 == (char *)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = ll_loadfunc(in_stack_00000008,unaff_retaddr,
                          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (int)((ulong)L_01 >> 0x20));
      if (iVar2 == 0) {
        iVar2 = 1;
      }
      else {
        if (iVar2 != 2) {
          loaderror(L_00,name_00);
        }
        lua_pushfstring(L_01,"\n\tno module \'%s\' in file \'%s\'",L_00,pcVar1,in_R8,in_R9,in_RDI);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int lj_cf_package_loader_croot(lua_State *L)
{
  const char *filename;
  const char *name = luaL_checkstring(L, 1);
  const char *p = strchr(name, '.');
  int st;
  if (p == NULL) return 0;  /* is root */
  lua_pushlstring(L, name, (size_t)(p - name));
  filename = findfile(L, lua_tostring(L, -1), "cpath");
  if (filename == NULL) return 1;  /* root not found */
  if ((st = ll_loadfunc(L, filename, name, 0)) != 0) {
    if (st != PACKAGE_ERR_FUNC) loaderror(L, filename);  /* real error */
    lua_pushfstring(L, "\n\tno module " LUA_QS " in file " LUA_QS,
		    name, filename);
    return 1;  /* function not found */
  }
  return 1;
}